

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_get_immutable_item(session_impl *this,sha1_hash *target)

{
  dht_tracker *this_00;
  function<void_(const_libtorrent::dht::item_&)> fStack_68;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::digest32<160L>,_const_libtorrent::dht::item_&)>
  local_48;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_48._M_f = (offset_in_session_impl_to_subr)get_immutable_callback;
    local_48._8_8_ = 0;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._0_8_ =
         *(undefined8 *)(target->m_number)._M_elems;
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems._8_8_ =
         *(undefined8 *)((target->m_number)._M_elems + 2);
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[4] =
         (target->m_number)._M_elems[4];
    local_48._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::aux::session_impl_*,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_libtorrent::aux::session_impl_*,_false>._M_head_impl = this;
    ::std::function<void(libtorrent::dht::item_const&)>::
    function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,libtorrent::digest32<160l>,std::_Placeholder<1>))(libtorrent::digest32<160l>,libtorrent::dht::item_const&)>,void>
              ((function<void(libtorrent::dht::item_const&)> *)&fStack_68,&local_48);
    libtorrent::dht::dht_tracker::get_item(this_00,target,&fStack_68);
    ::std::_Function_base::~_Function_base(&fStack_68.super__Function_base);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}